

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O1

spv_context spvContextCreate(spv_target_env env)

{
  spv_context psVar1;
  spv_ext_inst_table ext_inst_table;
  spv_operand_table operand_table;
  spv_opcode_table opcode_table;
  spv_ext_inst_table local_38;
  spv_operand_table local_30;
  spv_opcode_table local_28;
  
  if ((env < SPV_ENV_WEBGPU_0) || (env - SPV_ENV_UNIVERSAL_1_4 < 6)) {
    spvOpcodeTableGet(&local_28,env);
    spvOperandTableGet(&local_30,env);
    spvExtInstTableGet(&local_38,env);
    psVar1 = (spv_context)operator_new(0x40);
    psVar1->target_env = env;
    psVar1->opcode_table = local_28;
    psVar1->operand_table = local_30;
    psVar1->ext_inst_table = local_38;
    (psVar1->consumer).super__Function_base._M_manager = (_Manager_type)0x0;
    (psVar1->consumer)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(psVar1->consumer).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(psVar1->consumer).super__Function_base._M_functor + 8) = 0;
  }
  else {
    psVar1 = (spv_context)0x0;
  }
  return psVar1;
}

Assistant:

spv_context spvContextCreate(spv_target_env env) {
  switch (env) {
    case SPV_ENV_UNIVERSAL_1_0:
    case SPV_ENV_VULKAN_1_0:
    case SPV_ENV_UNIVERSAL_1_1:
    case SPV_ENV_OPENCL_1_2:
    case SPV_ENV_OPENCL_EMBEDDED_1_2:
    case SPV_ENV_OPENCL_2_0:
    case SPV_ENV_OPENCL_EMBEDDED_2_0:
    case SPV_ENV_OPENCL_2_1:
    case SPV_ENV_OPENCL_EMBEDDED_2_1:
    case SPV_ENV_OPENCL_2_2:
    case SPV_ENV_OPENCL_EMBEDDED_2_2:
    case SPV_ENV_OPENGL_4_0:
    case SPV_ENV_OPENGL_4_1:
    case SPV_ENV_OPENGL_4_2:
    case SPV_ENV_OPENGL_4_3:
    case SPV_ENV_OPENGL_4_5:
    case SPV_ENV_UNIVERSAL_1_2:
    case SPV_ENV_UNIVERSAL_1_3:
    case SPV_ENV_VULKAN_1_1:
    case SPV_ENV_VULKAN_1_1_SPIRV_1_4:
    case SPV_ENV_UNIVERSAL_1_4:
    case SPV_ENV_UNIVERSAL_1_5:
    case SPV_ENV_VULKAN_1_2:
    case SPV_ENV_UNIVERSAL_1_6:
    case SPV_ENV_VULKAN_1_3:
      break;
    default:
      return nullptr;
  }

  spv_opcode_table opcode_table;
  spv_operand_table operand_table;
  spv_ext_inst_table ext_inst_table;

  spvOpcodeTableGet(&opcode_table, env);
  spvOperandTableGet(&operand_table, env);
  spvExtInstTableGet(&ext_inst_table, env);

  return new spv_context_t{env, opcode_table, operand_table, ext_inst_table,
                           nullptr /* a null default consumer */};
}